

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_size nk_do_progress(nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_size value,
                      nk_size max,int modifiable,nk_style_progress *style,nk_input *in)

{
  float fVar1;
  nk_vec2 pad;
  nk_rect r;
  nk_size nVar2;
  nk_rect nVar3;
  nk_size local_b8;
  float local_a4;
  float local_9c;
  float local_98;
  float local_94;
  undefined1 auStack_78 [8];
  nk_rect cursor;
  nk_size prog_value;
  float prog_scale;
  nk_style_progress *style_local;
  int modifiable_local;
  nk_size max_local;
  nk_size value_local;
  nk_command_buffer *out_local;
  nk_flags *state_local;
  nk_rect bounds_local;
  
  state_local = bounds._0_8_;
  bounds_local.x = bounds.w;
  bounds_local.y = bounds.h;
  if (style == (nk_style_progress *)0x0) {
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x5355,
                  "nk_size nk_do_progress(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_size, nk_size, int, const struct nk_style_progress *, struct nk_input *)"
                 );
  }
  if (out != (nk_command_buffer *)0x0) {
    if ((out == (nk_command_buffer *)0x0) || (style == (nk_style_progress *)0x0)) {
      bounds_local.w = 0.0;
      bounds_local.h = 0.0;
    }
    else {
      fVar1 = (style->padding).x;
      if (fVar1 + fVar1 + style->border * 2.0 <= bounds_local.x) {
        local_94 = bounds_local.x;
      }
      else {
        fVar1 = (style->padding).x;
        local_94 = fVar1 + fVar1 + style->border * 2.0;
      }
      cursor.x = local_94;
      fVar1 = (style->padding).y;
      if (fVar1 + fVar1 + style->border * 2.0 <= bounds_local.y) {
        local_98 = bounds_local.y;
      }
      else {
        fVar1 = (style->padding).y;
        local_98 = fVar1 + fVar1 + style->border * 2.0;
      }
      cursor.y = local_98;
      pad = nk_vec2((style->padding).x + style->border,(style->padding).y + style->border);
      nVar3.w = bounds_local.x;
      nVar3._0_8_ = state_local;
      nVar3.h = bounds_local.y;
      nVar3 = nk_pad_rect(nVar3,pad);
      auStack_78 = nVar3._0_8_;
      cursor.x = nVar3.w;
      cursor.y = nVar3.h;
      local_9c = (float)value;
      local_a4 = (float)max;
      local_b8 = max;
      if (value < max) {
        local_b8 = value;
      }
      r.w = bounds_local.x;
      r._0_8_ = state_local;
      r.h = bounds_local.y;
      nVar2 = nk_progress_behavior(state,in,r,nVar3,max,local_b8,modifiable);
      cursor.x = cursor.x * (local_9c / local_a4);
      if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      }
      nk_draw_progress(out,*state,style,(nk_rect *)&state_local,(nk_rect *)auStack_78,value,max);
      bounds_local._8_8_ = nVar2;
      if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
      }
    }
    nVar2._0_4_ = bounds_local.w;
    nVar2._4_4_ = bounds_local.h;
    return nVar2;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x5356,
                "nk_size nk_do_progress(nk_flags *, struct nk_command_buffer *, struct nk_rect, nk_size, nk_size, int, const struct nk_style_progress *, struct nk_input *)"
               );
}

Assistant:

NK_LIB nk_size
nk_do_progress(nk_flags *state,
    struct nk_command_buffer *out, struct nk_rect bounds,
    nk_size value, nk_size max, int modifiable,
    const struct nk_style_progress *style, struct nk_input *in)
{
    float prog_scale;
    nk_size prog_value;
    struct nk_rect cursor;

    NK_ASSERT(style);
    NK_ASSERT(out);
    if (!out || !style) return 0;

    /* calculate progressbar cursor */
    cursor.w = NK_MAX(bounds.w, 2 * style->padding.x + 2 * style->border);
    cursor.h = NK_MAX(bounds.h, 2 * style->padding.y + 2 * style->border);
    cursor = nk_pad_rect(bounds, nk_vec2(style->padding.x + style->border, style->padding.y + style->border));
    prog_scale = (float)value / (float)max;

    /* update progressbar */
    prog_value = NK_MIN(value, max);
    prog_value = nk_progress_behavior(state, in, bounds, cursor,max, prog_value, modifiable);
    cursor.w = cursor.w * prog_scale;

    /* draw progressbar */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_progress(out, *state, style, &bounds, &cursor, value, max);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return prog_value;
}